

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iidentity32_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 *puVar33;
  __m128i *palVar34;
  int in_ECX;
  __m128i *in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  int i;
  int in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  int iVar35;
  longlong local_298;
  longlong lStack_290;
  longlong local_288;
  longlong lStack_280;
  int local_278;
  int local_274;
  __m128i *local_260;
  int local_250;
  int local_24c;
  longlong local_248;
  longlong lStack_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  longlong local_228;
  longlong lStack_220;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  for (local_274 = 0; local_274 < 0x20; local_274 = local_274 + 0x10) {
    puVar33 = (undefined8 *)(in_RDI + (long)local_274 * 0x10);
    uVar1 = *puVar33;
    uVar2 = puVar33[1];
    local_1c = 2;
    local_18._0_4_ = (int)uVar1;
    local_18._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_10._0_4_ = (undefined4)uVar2;
    uStack_10._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    palVar34 = in_RSI + local_274;
    *(int *)*palVar34 = (int)local_18 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_18._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_10;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_10._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 1) * 0x10);
    uVar3 = *puVar33;
    uVar4 = puVar33[1];
    local_3c = 2;
    local_38._0_4_ = (int)uVar3;
    local_38._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    uStack_30._0_4_ = (undefined4)uVar4;
    uStack_30._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    palVar34 = in_RSI + (local_274 + 1);
    *(int *)*palVar34 = (int)local_38 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_38._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_30;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_30._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 2) * 0x10);
    uVar5 = *puVar33;
    uVar6 = puVar33[1];
    local_5c = 2;
    local_58._0_4_ = (int)uVar5;
    local_58._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    uStack_50._0_4_ = (undefined4)uVar6;
    uStack_50._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    palVar34 = in_RSI + (local_274 + 2);
    *(int *)*palVar34 = (int)local_58 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_58._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_50;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_50._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 3) * 0x10);
    uVar7 = *puVar33;
    uVar8 = puVar33[1];
    local_7c = 2;
    local_78._0_4_ = (int)uVar7;
    local_78._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    uStack_70._0_4_ = (undefined4)uVar8;
    uStack_70._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
    palVar34 = in_RSI + (local_274 + 3);
    *(int *)*palVar34 = (int)local_78 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_78._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_70;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_70._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 4) * 0x10);
    uVar9 = *puVar33;
    uVar10 = puVar33[1];
    local_9c = 2;
    local_98._0_4_ = (int)uVar9;
    local_98._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    uStack_90._0_4_ = (undefined4)uVar10;
    uStack_90._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
    palVar34 = in_RSI + (local_274 + 4);
    *(int *)*palVar34 = (int)local_98 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_98._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_90;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_90._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 5) * 0x10);
    uVar11 = *puVar33;
    uVar12 = puVar33[1];
    local_bc = 2;
    local_b8._0_4_ = (int)uVar11;
    local_b8._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
    uStack_b0._0_4_ = (undefined4)uVar12;
    uStack_b0._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
    palVar34 = in_RSI + (local_274 + 5);
    *(int *)*palVar34 = (int)local_b8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_b8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_b0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_b0._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 6) * 0x10);
    uVar13 = *puVar33;
    uVar14 = puVar33[1];
    local_dc = 2;
    local_d8._0_4_ = (int)uVar13;
    local_d8._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
    uStack_d0._0_4_ = (undefined4)uVar14;
    uStack_d0._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
    palVar34 = in_RSI + (local_274 + 6);
    *(int *)*palVar34 = (int)local_d8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_d8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_d0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_d0._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 7) * 0x10);
    uVar15 = *puVar33;
    uVar16 = puVar33[1];
    local_fc = 2;
    local_f8._0_4_ = (int)uVar15;
    local_f8._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
    uStack_f0._0_4_ = (undefined4)uVar16;
    uStack_f0._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
    palVar34 = in_RSI + (local_274 + 7);
    *(int *)*palVar34 = (int)local_f8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_f8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_f0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_f0._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 8) * 0x10);
    uVar17 = *puVar33;
    uVar18 = puVar33[1];
    local_11c = 2;
    local_118._0_4_ = (int)uVar17;
    local_118._4_4_ = (undefined4)((ulong)uVar17 >> 0x20);
    uStack_110._0_4_ = (undefined4)uVar18;
    uStack_110._4_4_ = (undefined4)((ulong)uVar18 >> 0x20);
    palVar34 = in_RSI + (local_274 + 8);
    *(int *)*palVar34 = (int)local_118 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_118._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_110;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_110._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 9) * 0x10);
    uVar19 = *puVar33;
    uVar20 = puVar33[1];
    local_13c = 2;
    local_138._0_4_ = (int)uVar19;
    local_138._4_4_ = (undefined4)((ulong)uVar19 >> 0x20);
    uStack_130._0_4_ = (undefined4)uVar20;
    uStack_130._4_4_ = (undefined4)((ulong)uVar20 >> 0x20);
    palVar34 = in_RSI + (local_274 + 9);
    *(int *)*palVar34 = (int)local_138 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_138._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_130;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_130._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 10) * 0x10);
    uVar21 = *puVar33;
    uVar22 = puVar33[1];
    local_15c = 2;
    local_158._0_4_ = (int)uVar21;
    local_158._4_4_ = (undefined4)((ulong)uVar21 >> 0x20);
    uStack_150._0_4_ = (undefined4)uVar22;
    uStack_150._4_4_ = (undefined4)((ulong)uVar22 >> 0x20);
    palVar34 = in_RSI + (local_274 + 10);
    *(int *)*palVar34 = (int)local_158 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_158._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_150;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_150._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 0xb) * 0x10);
    uVar23 = *puVar33;
    uVar24 = puVar33[1];
    local_17c = 2;
    local_178._0_4_ = (int)uVar23;
    local_178._4_4_ = (undefined4)((ulong)uVar23 >> 0x20);
    uStack_170._0_4_ = (undefined4)uVar24;
    uStack_170._4_4_ = (undefined4)((ulong)uVar24 >> 0x20);
    palVar34 = in_RSI + (local_274 + 0xb);
    *(int *)*palVar34 = (int)local_178 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_178._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_170;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_170._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 0xc) * 0x10);
    uVar25 = *puVar33;
    uVar26 = puVar33[1];
    local_19c = 2;
    local_198._0_4_ = (int)uVar25;
    local_198._4_4_ = (undefined4)((ulong)uVar25 >> 0x20);
    uStack_190._0_4_ = (undefined4)uVar26;
    uStack_190._4_4_ = (undefined4)((ulong)uVar26 >> 0x20);
    palVar34 = in_RSI + (local_274 + 0xc);
    *(int *)*palVar34 = (int)local_198 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_198._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_190;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_190._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 0xd) * 0x10);
    uVar27 = *puVar33;
    uVar28 = puVar33[1];
    local_1bc = 2;
    local_1b8._0_4_ = (int)uVar27;
    local_1b8._4_4_ = (undefined4)((ulong)uVar27 >> 0x20);
    uStack_1b0._0_4_ = (undefined4)uVar28;
    uStack_1b0._4_4_ = (undefined4)((ulong)uVar28 >> 0x20);
    palVar34 = in_RSI + (local_274 + 0xd);
    *(int *)*palVar34 = (int)local_1b8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_1b8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_1b0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_1b0._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 0xe) * 0x10);
    uVar29 = *puVar33;
    uVar30 = puVar33[1];
    local_1dc = 2;
    local_1d8._0_4_ = (int)uVar29;
    local_1d8._4_4_ = (undefined4)((ulong)uVar29 >> 0x20);
    uStack_1d0._0_4_ = (undefined4)uVar30;
    uStack_1d0._4_4_ = (undefined4)((ulong)uVar30 >> 0x20);
    palVar34 = in_RSI + (local_274 + 0xe);
    *(int *)*palVar34 = (int)local_1d8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_1d8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_1d0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_1d0._4_4_;
    puVar33 = (undefined8 *)(in_RDI + (long)(local_274 + 0xf) * 0x10);
    uVar31 = *puVar33;
    uVar32 = puVar33[1];
    local_1fc = 2;
    local_1f8._0_4_ = (int)uVar31;
    local_1f8._4_4_ = (undefined4)((ulong)uVar31 >> 0x20);
    uStack_1f0._0_4_ = (undefined4)uVar32;
    uStack_1f0._4_4_ = (undefined4)((ulong)uVar32 >> 0x20);
    palVar34 = in_RSI + (local_274 + 0xf);
    *(int *)*palVar34 = (int)local_1f8 << 2;
    *(undefined4 *)((long)*palVar34 + 4) = local_1f8._4_4_;
    *(undefined4 *)(*palVar34 + 1) = (undefined4)uStack_1f0;
    *(undefined4 *)((long)*palVar34 + 0xc) = uStack_1f0._4_4_;
    local_1f8 = uVar31;
    uStack_1f0 = uVar32;
    local_1d8 = uVar29;
    uStack_1d0 = uVar30;
    local_1b8 = uVar27;
    uStack_1b0 = uVar28;
    local_198 = uVar25;
    uStack_190 = uVar26;
    local_178 = uVar23;
    uStack_170 = uVar24;
    local_158 = uVar21;
    uStack_150 = uVar22;
    local_138 = uVar19;
    uStack_130 = uVar20;
    local_118 = uVar17;
    uStack_110 = uVar18;
    local_f8 = uVar15;
    uStack_f0 = uVar16;
    local_d8 = uVar13;
    uStack_d0 = uVar14;
    local_b8 = uVar11;
    uStack_b0 = uVar12;
    local_98 = uVar9;
    uStack_90 = uVar10;
    local_78 = uVar7;
    uStack_70 = uVar8;
    local_58 = uVar5;
    uStack_50 = uVar6;
    local_38 = uVar3;
    uStack_30 = uVar4;
    local_18 = uVar1;
    uStack_10 = uVar2;
  }
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      iVar35 = 0x10;
    }
    else {
      iVar35 = in_R8D + 6;
    }
    local_278._0_1_ = (char)iVar35;
    local_24c = -(1 << ((char)local_278 - 1U & 0x1f));
    local_288 = CONCAT44(local_24c,local_24c);
    lStack_280 = CONCAT44(local_24c,local_24c);
    local_250 = (1 << ((char)local_278 - 1U & 0x1f)) + -1;
    local_298 = CONCAT44(local_250,local_250);
    lStack_290 = CONCAT44(local_250,local_250);
    local_278 = iVar35;
    local_260 = in_RSI;
    local_248 = local_288;
    lStack_240 = lStack_280;
    local_238 = local_24c;
    local_234 = local_24c;
    local_230 = local_24c;
    local_22c = local_24c;
    local_228 = local_298;
    lStack_220 = lStack_290;
    local_20c = local_250;
    local_208 = local_250;
    local_204 = local_250;
    local_200 = local_250;
    round_shift_8x8((__m128i *)CONCAT44(iVar35,in_stack_fffffffffffffd60),in_stack_fffffffffffffd5c)
    ;
    round_shift_8x8((__m128i *)CONCAT44(iVar35,in_stack_fffffffffffffd60),in_stack_fffffffffffffd5c)
    ;
    highbd_clamp_epi32_sse4_1(local_260,local_260,(__m128i *)&local_288,(__m128i *)&local_298,0x20);
  }
  return;
}

Assistant:

static void iidentity32_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  (void)bit;
  for (int i = 0; i < 32; i += 16) {
    out[i] = _mm_slli_epi32(in[i], 2);
    out[i + 1] = _mm_slli_epi32(in[i + 1], 2);
    out[i + 2] = _mm_slli_epi32(in[i + 2], 2);
    out[i + 3] = _mm_slli_epi32(in[i + 3], 2);
    out[i + 4] = _mm_slli_epi32(in[i + 4], 2);
    out[i + 5] = _mm_slli_epi32(in[i + 5], 2);
    out[i + 6] = _mm_slli_epi32(in[i + 6], 2);
    out[i + 7] = _mm_slli_epi32(in[i + 7], 2);
    out[i + 8] = _mm_slli_epi32(in[i + 8], 2);
    out[i + 9] = _mm_slli_epi32(in[i + 9], 2);
    out[i + 10] = _mm_slli_epi32(in[i + 10], 2);
    out[i + 11] = _mm_slli_epi32(in[i + 11], 2);
    out[i + 12] = _mm_slli_epi32(in[i + 12], 2);
    out[i + 13] = _mm_slli_epi32(in[i + 13], 2);
    out[i + 14] = _mm_slli_epi32(in[i + 14], 2);
    out[i + 15] = _mm_slli_epi32(in[i + 15], 2);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    round_shift_8x8(out + 16, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}